

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDP_Solver.cpp
# Opt level: O1

double runOneSimulation(QTable *q,PlanningUnitDecPOMDPDiscrete *np,SimulationDecPOMDPDiscrete *sim)

{
  long *plVar1;
  ulong uVar2;
  AgentMDP *this;
  ulong uVar3;
  uint uVar4;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  AgentFullyObservable *newAgent;
  SimulationResult result;
  AgentMDP agent;
  void *local_d8;
  iterator iStack_d0;
  AgentFullyObservable **local_c8;
  AgentMDP *local_c0;
  double local_b8 [6];
  AgentMDP local_88 [88];
  
  uVar3 = 0;
  AgentMDP::AgentMDP(local_88,np,0,q);
  local_d8 = (void *)0x0;
  iStack_d0._M_current = (AgentFullyObservable **)0x0;
  local_c8 = (AgentFullyObservable **)0x0;
  while( true ) {
    uVar2 = (**(code **)(*(long *)np + 0x30))(np);
    if (uVar2 <= uVar3) break;
    this = (AgentMDP *)operator_new(0x58);
    AgentMDP::AgentMDP(this,local_88);
    local_c0 = this;
    (**(code **)(*(long *)(this + *(long *)(*(long *)this + -0x18)) + 0x18))
              (this + *(long *)(*(long *)this + -0x18),uVar3);
    if (iStack_d0._M_current == local_c8) {
      std::vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>>::
      _M_realloc_insert<AgentFullyObservable*const&>
                ((vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>> *)&local_d8,
                 iStack_d0,(AgentFullyObservable **)&local_c0);
    }
    else {
      *iStack_d0._M_current = (AgentFullyObservable *)local_c0;
      iStack_d0._M_current = iStack_d0._M_current + 1;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            ((SimulationDecPOMDPDiscrete *)local_b8,
             (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)sim);
  uVar4 = 0;
  while( true ) {
    uVar3 = (**(code **)(*(long *)np + 0x30))(np);
    if (uVar3 <= uVar4) break;
    plVar1 = *(long **)((long)local_d8 + (ulong)uVar4 * 8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    uVar4 = uVar4 + 1;
  }
  SimulationResult::~SimulationResult((SimulationResult *)local_b8);
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  AgentMDP::~AgentMDP(local_88);
  return local_b8[0];
}

Assistant:

double runOneSimulation(  const QTable & q,
                          const PlanningUnitDecPOMDPDiscrete *np,
                          const SimulationDecPOMDPDiscrete &sim
                          )
{
    AgentMDP agent(np, 0, q);
    AgentFullyObservable *newAgent;
    vector<AgentFullyObservable*> agents;

    for(Index i=0; i < np->GetNrAgents(); i++)
    {
        newAgent=new AgentMDP(agent);
        newAgent->SetIndex(i);
        agents.push_back(newAgent);
    }
    SimulationResult result=sim.RunSimulations(agents);
    double avgReward=result.GetAvgReward();

    for(Index i=0; i < np->GetNrAgents(); i++)
        delete agents[i];

    return(avgReward);
}